

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O0

void amrex::FArrayBox::setFormat(Format fmt)

{
  int iVar1;
  RealDescriptor *pRVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  void *__child_stack;
  void *__child_stack_00;
  void *__child_stack_01;
  __fn *in_RSI;
  int in_EDI;
  void *in_R8;
  FABio *fio;
  RealDescriptor *in_stack_ffffffffffffff78;
  FABio_binary *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff90;
  
  iVar1 = 0x16c84e0;
  switch(in_EDI) {
  case 0:
    operator_new(8);
    FABio_ascii::FABio_ascii((FABio_ascii *)in_stack_ffffffffffffff80);
    break;
  case 1:
  case 5:
    operator_new(0x10);
    pRVar2 = FPC::Ieee32NormalRealDescriptor();
    RealDescriptor::clone(pRVar2,in_RSI,__child_stack_00,iVar1,in_R8);
    FABio_binary::FABio_binary(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  case 2:
    operator_new(0x10);
    pRVar2 = FPC::NativeRealDescriptor();
    RealDescriptor::clone(pRVar2,in_RSI,__child_stack,iVar1,in_R8);
    FABio_binary::FABio_binary(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    break;
  default:
    poVar3 = ErrorStream();
    poVar3 = std::operator<<(poVar3,"FArrayBox::setFormat(): Bad FABio::Format = ");
    std::ostream::operator<<(poVar3,in_EDI);
    Abort_host(in_stack_ffffffffffffff90);
    break;
  case 4:
    operator_new(8);
    FABio_8bit::FABio_8bit((FABio_8bit *)in_stack_ffffffffffffff80);
    break;
  case 6:
    in_stack_ffffffffffffff80 = (FABio_binary *)operator_new(0x10);
    pRVar2 = FPC::Native32RealDescriptor();
    iVar1 = RealDescriptor::clone(pRVar2,in_RSI,__child_stack_01,iVar1,in_R8);
    FABio_binary::FABio_binary
              (in_stack_ffffffffffffff80,(RealDescriptor *)CONCAT44(extraout_var,iVar1));
  }
  format = in_EDI;
  setFABio(&in_stack_ffffffffffffff80->super_FABio);
  return;
}

Assistant:

void
FArrayBox::setFormat (FABio::Format fmt)
{
    FABio* fio = 0;

    switch (fmt)
    {
    case FABio::FAB_ASCII:
        fio = new FABio_ascii;
        break;
    case FABio::FAB_8BIT:
        fio = new FABio_8bit;
        break;
    case FABio::FAB_NATIVE:
        fio = new FABio_binary(FPC::NativeRealDescriptor().clone());
        break;
    case FABio::FAB_IEEE:
        //amrex::Warning("FABio::FAB_IEEE has been deprecated");
        //
        // Fall through ...
        //
    case FABio::FAB_IEEE_32:
        fio = new FABio_binary(FPC::Ieee32NormalRealDescriptor().clone());
        break;
    case FABio::FAB_NATIVE_32:
        fio = new FABio_binary(FPC::Native32RealDescriptor().clone());
        break;
    default:
        amrex::ErrorStream() << "FArrayBox::setFormat(): Bad FABio::Format = " << fmt;
        amrex::Abort();
    }

    FArrayBox::format = fmt;

    setFABio(fio);
}